

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

uint32_t __thiscall
toml::detail::syntax::non_ascii_key_char::read_utf8(non_ascii_key_char *this,location *loc)

{
  ulong uVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar5 = loc->location_;
  lVar3 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar4 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar3;
  if (uVar5 < uVar4) {
    bVar8 = *(byte *)(lVar3 + uVar5);
  }
  else {
    bVar8 = 0;
  }
  if (uVar5 + 1 < uVar4) {
    if (*(char *)(lVar3 + uVar5) == '\n') {
      loc->line_number_ = loc->line_number_ + 1;
      sVar10 = 1;
    }
    else {
      sVar10 = loc->column_number_ + 1;
    }
    loc->column_number_ = sVar10;
    uVar5 = uVar5 + 1;
  }
  else if (uVar4 != uVar5) {
    sVar10 = loc->line_number_;
    sVar11 = loc->column_number_;
    uVar12 = uVar5;
    do {
      if (*(char *)(lVar3 + uVar12) == '\n') {
        sVar10 = sVar10 + 1;
        loc->line_number_ = sVar10;
        sVar11 = 1;
      }
      else {
        sVar11 = sVar11 + 1;
      }
      loc->column_number_ = sVar11;
      uVar12 = uVar12 + 1;
      uVar5 = uVar4;
    } while (uVar4 != uVar12);
  }
  loc->location_ = uVar5;
  uVar7 = (uint)bVar8;
  uVar6 = uVar7;
  if ((char)bVar8 < '\0') {
    if ((uVar7 & 0xffffffe0) == 0xc0) {
      uVar9 = 0;
      if (uVar5 < uVar4) {
        uVar9 = *(byte *)(lVar3 + uVar5) & 0x3f;
      }
      if (uVar5 + 1 < uVar4) {
        if (*(char *)(lVar3 + uVar5) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar10 = 1;
        }
        else {
          sVar10 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar10;
        uVar4 = uVar5 + 1;
      }
      else if (uVar4 != uVar5) {
        sVar10 = loc->line_number_;
        sVar11 = loc->column_number_;
        do {
          if (*(char *)(lVar3 + uVar5) == '\n') {
            sVar10 = sVar10 + 1;
            loc->line_number_ = sVar10;
            sVar11 = 1;
          }
          else {
            sVar11 = sVar11 + 1;
          }
          loc->column_number_ = sVar11;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      loc->location_ = uVar4;
      uVar7 = (uVar7 & 0x1f) << 6;
      uVar6 = 0xffffffff;
      if (0x7f < uVar7) {
        uVar6 = uVar9 | uVar7;
      }
    }
    else if ((uVar7 & 0xfffffff0) == 0xe0) {
      uVar9 = 0;
      if (uVar5 < uVar4) {
        uVar9 = (*(byte *)(lVar3 + uVar5) & 0x3f) << 6;
      }
      uVar12 = uVar5 + 1;
      if (uVar12 < uVar4) {
        if (*(char *)(lVar3 + uVar5) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar10 = 1;
        }
        else {
          sVar10 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar10;
        loc->location_ = uVar12;
        uVar6 = 0xffffffff;
        if (uVar12 < uVar4) {
          uVar13 = (uint)*(byte *)(lVar3 + 1 + uVar5);
          if (uVar5 + 2 < uVar4) {
            if (uVar13 == 10) {
              loc->line_number_ = loc->line_number_ + 1;
              sVar10 = 1;
            }
            else {
              sVar10 = loc->column_number_ + 1;
            }
            loc->column_number_ = sVar10;
            uVar4 = uVar5 + 2;
          }
          else {
            sVar10 = loc->line_number_;
            sVar11 = loc->column_number_;
            do {
              if (*(char *)(lVar3 + uVar12) == '\n') {
                sVar10 = sVar10 + 1;
                loc->line_number_ = sVar10;
                sVar11 = 1;
              }
              else {
                sVar11 = sVar11 + 1;
              }
              loc->column_number_ = sVar11;
              uVar12 = uVar12 + 1;
            } while (uVar4 != uVar12);
          }
          loc->location_ = uVar4;
          uVar9 = uVar9 | (uVar7 & 0xf) << 0xc;
          uVar6 = 0xffffffff;
          if (0x7ff < uVar9) {
            uVar6 = uVar13 & 0x3f | uVar9;
          }
        }
      }
      else {
        if (uVar4 != uVar5) {
          sVar10 = loc->line_number_;
          sVar11 = loc->column_number_;
          do {
            if (*(char *)(lVar3 + uVar5) == '\n') {
              sVar10 = sVar10 + 1;
              loc->line_number_ = sVar10;
              sVar11 = 1;
            }
            else {
              sVar11 = sVar11 + 1;
            }
            loc->column_number_ = sVar11;
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        loc->location_ = uVar4;
        uVar6 = 0xffffffff;
      }
    }
    else {
      uVar6 = 0xffffffff;
      if ((uVar7 & 0xfffffff8) == 0xf0) {
        uVar9 = 0;
        if (uVar5 < uVar4) {
          uVar9 = (*(byte *)(lVar3 + uVar5) & 0x3f) << 0xc;
        }
        uVar12 = uVar5 + 1;
        if (uVar12 < uVar4) {
          if (*(char *)(lVar3 + uVar5) == '\n') {
            loc->line_number_ = loc->line_number_ + 1;
            sVar10 = 1;
          }
          else {
            sVar10 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar10;
          loc->location_ = uVar12;
          if (uVar4 <= uVar12) {
            return 0xffffffff;
          }
          uVar1 = uVar5 + 2;
          if (uVar1 < uVar4) {
            uVar13 = (uint)*(byte *)(lVar3 + 1 + uVar5);
            if (uVar13 == 10) {
              loc->line_number_ = loc->line_number_ + 1;
              sVar10 = 1;
            }
            else {
              sVar10 = loc->column_number_ + 1;
            }
            loc->column_number_ = sVar10;
            loc->location_ = uVar1;
            bVar8 = *(byte *)(lVar3 + uVar1);
            location::advance(loc,1);
            uVar9 = uVar9 | (uVar7 & 7) << 0x12;
            if (uVar9 < 0x10000) {
              return 0xffffffff;
            }
            return bVar8 & 0x3f | (uVar13 & 0x3f) << 6 | uVar9;
          }
          sVar10 = loc->line_number_;
          sVar11 = loc->column_number_;
          do {
            if (*(char *)(lVar3 + uVar12) == '\n') {
              sVar10 = sVar10 + 1;
              loc->line_number_ = sVar10;
              sVar11 = 1;
            }
            else {
              sVar11 = sVar11 + 1;
            }
            loc->column_number_ = sVar11;
            uVar12 = uVar12 + 1;
          } while (uVar4 != uVar12);
        }
        else if (uVar4 != uVar5) {
          sVar10 = loc->line_number_;
          sVar11 = loc->column_number_;
          do {
            if (*(char *)(lVar3 + uVar5) == '\n') {
              sVar10 = sVar10 + 1;
              loc->line_number_ = sVar10;
              sVar11 = 1;
            }
            else {
              sVar11 = sVar11 + 1;
            }
            loc->column_number_ = sVar11;
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        loc->location_ = uVar4;
      }
    }
  }
  return uVar6;
}

Assistant:

TOML11_INLINE std::uint32_t non_ascii_key_char::read_utf8(location& loc) const
{
    // U+0000   ... U+0079  ; 0xxx_xxxx
    // U+0080   ... U+07FF  ; 110y_yyyx 10xx_xxxx;
    // U+0800   ... U+FFFF  ; 1110_yyyy 10yx_xxxx 10xx_xxxx
    // U+010000 ... U+10FFFF; 1111_0yyy 10yy_xxxx 10xx_xxxx 10xx_xxxx

    const unsigned char b1 = loc.current(); loc.advance(1);
    if(b1 < 0x80)
    {
        return static_cast<std::uint32_t>(b1);
    }
    else if((b1 >> 5) == 6) // 0b110 == 6
    {
        const auto b2 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 5) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t codep = (c1 << 6) + c2;

        if(codep < 0x80)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else if((b1 >> 4) == 14) // 0b1110 == 14
    {
        const auto b2 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b3 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 4) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t c3 = b3 & ((1 << 6) - 1);

        const std::uint32_t codep = (c1 << 12) + (c2 << 6) + c3;
        if(codep < 0x800)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else if((b1 >> 3) == 30) // 0b11110 == 30
    {
        const auto b2 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b3 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b4 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 3) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t c3 = b3 & ((1 << 6) - 1);
        const std::uint32_t c4 = b4 & ((1 << 6) - 1);
        const std::uint32_t codep = (c1 << 18) + (c2 << 12) + (c3 << 6) + c4;

        if(codep < 0x10000)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else // not a Unicode codepoint in UTF-8
    {
        return 0xFFFFFFFF;
    }
}